

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxClassTypeCast::Emit(FxClassTypeCast *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  FName local_3c;
  DObject *local_38;
  PSymbol *sym;
  VMFunction *callfunc;
  ExpEmit clsname;
  VMFunctionBuilder *build_local;
  FxClassTypeCast *this_local;
  ExpEmit dest;
  
  clsname = (ExpEmit)build;
  if (this->basex->ValueType == (PType *)TypeName) {
    iVar4 = (*this->basex->_vptr_FxExpression[9])(this->basex,build);
    callfunc._4_1_ = (byte)extraout_var;
    callfunc = (VMFunction *)CONCAT44(extraout_var,iVar4);
    if (((callfunc._4_1_ ^ 0xff) & 1) == 0) {
      __assert_fail("!clsname.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2568,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)clsname,3,1);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)clsname,0x46,0,(uint)callfunc._2_1_,(uint)(ushort)callfunc);
    EVar1 = clsname;
    uVar3 = VMFunctionBuilder::GetConstantAddress
                      ((VMFunctionBuilder *)clsname,this->desttype,'\x01');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar1,0x46,0,7,uVar3);
    FName::FName(&local_3c,NAME_BuiltinNameToClass);
    local_38 = (DObject *)FindBuiltinFunction(&local_3c,BuiltinNameToClass);
    bVar2 = DObject::IsKindOf(local_38,PSymbolVMFunction::RegistrationInfo.MyClass);
    EVar1 = clsname;
    if (!bVar2) {
      __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2571,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    if (local_38[1]._vptr_DObject == (_func_int **)0x0) {
      __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2572,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    sym = (PSymbol *)local_38[1]._vptr_DObject;
    uVar3 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)clsname,sym,'\x01');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar1,0x49,uVar3,2,1);
    VMFunctionBuilder::Emit((VMFunctionBuilder *)clsname,0x4d,0,3,(uint)(uint16_t)this_local);
    ExpEmit::Free((ExpEmit *)&callfunc,(VMFunctionBuilder *)clsname);
  }
  else {
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\x01');
    ExpEmit::ExpEmit((ExpEmit *)&this_local,uVar3,3,true,false);
  }
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (uint16_t)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *build)
{
	if (basex->ValueType != TypeName)
	{
		return ExpEmit(build->GetConstantAddress(nullptr, ATAG_OBJECT), REGT_POINTER, true);
	}
	ExpEmit clsname = basex->Emit(build);
	assert(!clsname.Konst);
	ExpEmit dest(build, REGT_POINTER);
	build->Emit(OP_PARAM, 0, clsname.RegType, clsname.RegNum);
	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(const_cast<PClass *>(desttype), ATAG_OBJECT));

	// Call the BuiltinNameToClass function to convert from 'name' to class.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinNameToClass, BuiltinNameToClass);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	build->Emit(OP_CALL_K, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);
	build->Emit(OP_RESULT, 0, REGT_POINTER, dest.RegNum);
	clsname.Free(build);
	return dest;
}